

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_protocol_check_outgoing_commands
              (ENetHost *host,ENetPeer *peer,ENetList *sentUnreliableCommands)

{
  ushort *puVar1;
  byte *pbVar2;
  ENetList *pEVar3;
  ENetList *pEVar4;
  ENetList *pEVar5;
  short *psVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  short sVar10;
  short sVar11;
  enet_uint32 eVar12;
  ENetChannel *pEVar13;
  size_t sVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  bool bVar26;
  _ENetListNode *p_Var27;
  ulong uVar28;
  byte bVar29;
  uint uVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  _ENetListNode *p_Var34;
  int iVar35;
  long lVar36;
  _ENetListNode *p_Var37;
  long *plVar38;
  undefined4 *puVar39;
  ENetListIterator result;
  _ENetListNode *p_Var40;
  undefined8 *puVar41;
  _ENetListNode *p_Var42;
  _ENetListNode *local_70;
  
  lVar32 = host->commandCount * 0x30 + 0x72;
  lVar36 = host->bufferCount * 0x10 + 0x680;
  pEVar3 = &peer->outgoingCommands;
  p_Var37 = (peer->outgoingCommands).sentinel.next;
  local_70 = (peer->outgoingSendReliableCommands).sentinel.next;
  pEVar4 = &peer->outgoingSendReliableCommands;
  pEVar5 = &peer->sentReliableCommands;
  iVar35 = 1;
  bVar26 = true;
LAB_0010779d:
  p_Var27 = local_70;
  p_Var42 = p_Var37;
LAB_001077c9:
  do {
    if (p_Var42 == &pEVar3->sentinel) {
      if (p_Var27 == &pEVar4->sentinel) goto LAB_00107c92;
LAB_001077fb:
      p_Var34 = p_Var27->next;
      p_Var37 = p_Var42;
      p_Var40 = p_Var27;
      local_70 = p_Var34;
    }
    else {
      if ((p_Var27 != &pEVar4->sentinel) &&
         (86399999 <
          (uint)(*(int *)((long)&p_Var27[1].previous + 4) - *(int *)((long)&p_Var42[1].previous + 4)
                ))) goto LAB_001077fb;
      p_Var34 = p_Var42->next;
      p_Var37 = p_Var34;
      p_Var40 = p_Var42;
      local_70 = p_Var27;
    }
    bVar7 = *(byte *)&p_Var40[2].previous;
    iVar31 = iVar35;
    if (-1 < (char)bVar7) break;
    bVar8 = *(byte *)((long)&p_Var40[2].previous + 1);
    if ((((ulong)bVar8 < peer->channelCount) &&
        (pEVar13 = peer->channels, pEVar13 != (ENetChannel *)0x0)) &&
       ((p_Var27 = local_70, !bVar26 ||
        ((uVar9 = *(ushort *)&p_Var40[1].next,
         (uVar9 & 0xfff) == 0 && *(short *)((long)&p_Var40[2].next + 6) == 0 &&
         ((p_Var27 = &pEVar4->sentinel,
          0xfff < *(ushort *)
                   ((long)pEVar13->reliableWindows +
                   (ulong)((uVar9 >> 0xc) - 1 & 0xf) * 2 + (ulong)((uint)bVar8 * 0x50)) ||
          (bVar29 = (byte)(uVar9 >> 0xc),
          ((0x3ffU >> (0x10 - bVar29 & 0x1f) | 0x3ff << bVar29) &
          (uint)*(ushort *)((long)pEVar13->reliableWindows + ((ulong)((uint)bVar8 * 0x50) - 2))) !=
          0)))))))) goto LAB_00107a24;
    iVar31 = 0;
    if (p_Var40[5].previous == (_ENetListNode *)0x0) break;
    uVar30 = peer->windowSize * peer->packetThrottle >> 5;
    if (uVar30 <= peer->mtu) {
      uVar30 = peer->mtu;
    }
    p_Var27 = &pEVar4->sentinel;
    p_Var42 = p_Var37;
  } while (uVar30 < (uint)*(ushort *)((long)&p_Var40[2].next + 4) + peer->reliableDataInTransit);
  iVar35 = iVar31;
  if (lVar36 < 0xa80 && lVar32 < 0x672) {
    uVar28 = commandSizes[bVar7 & 0xf];
    sVar14 = host->packetSize;
    uVar33 = peer->mtu - sVar14;
    if (uVar28 <= uVar33) {
      p_Var27 = p_Var40[5].previous;
      if (p_Var27 == (_ENetListNode *)0x0) {
        plVar38 = (long *)((long)host->commands + lVar36 + -0x62);
        if (-1 < (char)bVar7) {
          p_Var27 = p_Var40->previous;
          p_Var27->next = p_Var34;
          p_Var34->previous = p_Var27;
          goto LAB_00107be6;
        }
      }
      else {
        if (((uint)uVar33 & 0xffff) <
            (uint)(ushort)(*(short *)((long)&p_Var40[2].next + 4) + (short)uVar28))
        goto LAB_00107c86;
        if (-1 < (char)bVar7) {
          if ((*(int *)&p_Var40[2].next == 0) &&
             (uVar30 = peer->packetThrottleCounter + 7 & 0x1f, peer->packetThrottleCounter = uVar30,
             peer->packetThrottle < uVar30)) {
            sVar10 = *(short *)&p_Var40[1].next;
            sVar11 = *(short *)((long)&p_Var40[1].next + 2);
            while( true ) {
              p_Var42 = p_Var37;
              p_Var27->next = (_ENetListNode *)((long)&p_Var27->next[-1].previous + 7);
              if (p_Var27->next == (_ENetListNode *)0x0) {
                if (p_Var27[2].next != (_ENetListNode *)0x0) {
                  (*(code *)p_Var27[2].next)(p_Var27);
                }
                (*callbacks.free)(p_Var27);
                p_Var34 = p_Var40->next;
              }
              p_Var37 = p_Var40->previous;
              p_Var37->next = p_Var34;
              p_Var34->previous = p_Var37;
              (*callbacks.free)(p_Var40);
              p_Var27 = local_70;
              if (((p_Var42 == &pEVar3->sentinel) || (*(short *)&p_Var42[1].next != sVar10)) ||
                 (*(short *)((long)&p_Var42[1].next + 2) != sVar11)) break;
              p_Var34 = p_Var42->next;
              p_Var27 = p_Var42[5].previous;
              p_Var37 = p_Var34;
              p_Var40 = p_Var42;
            }
            goto LAB_001077c9;
          }
          plVar38 = (long *)((long)host->commands + lVar36 + -0x62);
          p_Var27 = p_Var40->previous;
          p_Var27->next = p_Var34;
          p_Var34->previous = p_Var27;
          p_Var27 = (sentUnreliableCommands->sentinel).previous;
          p_Var40->previous = p_Var27;
          p_Var40->next = &sentUnreliableCommands->sentinel;
          p_Var27->next = p_Var40;
          (sentUnreliableCommands->sentinel).previous = p_Var40;
          goto LAB_00107be6;
        }
        plVar38 = (long *)((long)host->commands + lVar36 + -0x62);
      }
      bVar7 = *(byte *)((long)&p_Var40[2].previous + 1);
      if ((((ulong)bVar7 < peer->channelCount) &&
          (pEVar13 = peer->channels, pEVar13 != (ENetChannel *)0x0)) &&
         (*(short *)((long)&p_Var40[2].next + 6) == 0)) {
        uVar9 = *(ushort *)&p_Var40[1].next;
        puVar1 = (ushort *)((long)pEVar13->reliableWindows + ((ulong)((uint)bVar7 * 0x50) - 2));
        *puVar1 = *puVar1 | (ushort)(1 << (byte)(uVar9 >> 0xc));
        psVar6 = (short *)((long)pEVar13->reliableWindows +
                          (ulong)(uVar9 >> 0xc) * 2 + (ulong)((uint)bVar7 * 0x50));
        *psVar6 = *psVar6 + 1;
      }
      psVar6 = (short *)((long)&p_Var40[2].next + 6);
      *psVar6 = *psVar6 + 1;
      iVar31 = *(int *)&p_Var40[1].previous;
      if (iVar31 == 0) {
        iVar31 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
        *(int *)&p_Var40[1].previous = iVar31;
      }
      eVar12 = host->serviceTime;
      if ((pEVar5->sentinel).next == &pEVar5->sentinel) {
        peer->nextTimeout = iVar31 + eVar12;
      }
      p_Var27 = p_Var40->previous;
      p_Var27->next = p_Var34;
      p_Var34->previous = p_Var27;
      p_Var27 = (peer->sentReliableCommands).sentinel.previous;
      p_Var40->previous = p_Var27;
      p_Var40->next = &pEVar5->sentinel;
      p_Var27->next = p_Var40;
      (peer->sentReliableCommands).sentinel.previous = p_Var40;
      *(enet_uint32 *)((long)&p_Var40[1].next + 4) = eVar12;
      pbVar2 = (byte *)((long)&host->headerFlags + 1);
      *pbVar2 = *pbVar2 | 0x80;
      peer->reliableDataInTransit =
           peer->reliableDataInTransit + (uint)*(ushort *)((long)&p_Var40[2].next + 4);
LAB_00107be6:
      puVar41 = (undefined8 *)((long)host->commands + lVar36 + -0x72);
      puVar39 = (undefined4 *)((long)host->commands + lVar32 + -0x72);
      *puVar41 = puVar39;
      puVar41[1] = uVar28;
      host->packetSize = sVar14 + uVar28;
      uVar15 = *(undefined4 *)&p_Var40[2].previous;
      uVar16 = *(undefined4 *)((long)&p_Var40[2].previous + 4);
      uVar17 = *(undefined4 *)&p_Var40[3].next;
      uVar18 = *(undefined4 *)((long)&p_Var40[3].next + 4);
      uVar19 = *(undefined4 *)&p_Var40[3].previous;
      uVar20 = *(undefined4 *)((long)&p_Var40[3].previous + 4);
      uVar21 = *(undefined4 *)&p_Var40[4].next;
      uVar22 = *(undefined4 *)((long)&p_Var40[4].next + 4);
      uVar23 = *(undefined4 *)((long)&p_Var40[4].previous + 4);
      uVar24 = *(undefined4 *)&p_Var40[5].next;
      uVar25 = *(undefined4 *)((long)&p_Var40[5].next + 4);
      puVar39[8] = *(undefined4 *)&p_Var40[4].previous;
      puVar39[9] = uVar23;
      puVar39[10] = uVar24;
      puVar39[0xb] = uVar25;
      puVar39[4] = uVar19;
      puVar39[5] = uVar20;
      puVar39[6] = uVar21;
      puVar39[7] = uVar22;
      *puVar39 = uVar15;
      puVar39[1] = uVar16;
      puVar39[2] = uVar17;
      puVar39[3] = uVar18;
      if (p_Var40[5].previous == (_ENetListNode *)0x0) {
        if (-1 < *(char *)&p_Var40[2].previous) {
          (*callbacks.free)(p_Var40);
        }
      }
      else {
        *plVar38 = (long)&(p_Var40[5].previous[1].next)->next + (ulong)*(uint *)&p_Var40[2].next;
        uVar28 = (ulong)*(ushort *)((long)&p_Var40[2].next + 4);
        plVar38[1] = uVar28;
        host->packetSize = host->packetSize + uVar28;
        lVar36 = lVar36 + 0x10;
      }
      peer->packetsSent = peer->packetsSent + 1;
      peer->totalPacketsSent = peer->totalPacketsSent + 1;
      lVar32 = lVar32 + 0x30;
      lVar36 = lVar36 + 0x10;
      goto LAB_0010779d;
    }
  }
LAB_00107c86:
  *(byte *)&peer->flags = (byte)peer->flags | 2;
LAB_00107c92:
  host->commandCount = (lVar32 + -0x72 >> 4) * -0x5555555555555555;
  host->bufferCount = lVar36 + -0x680 >> 4;
  if ((((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
       ((pEVar3->sentinel).next == &pEVar3->sentinel)) &&
      ((pEVar4->sentinel).next == &pEVar4->sentinel)) &&
     (((pEVar5->sentinel).next == &pEVar5->sentinel &&
      ((sentUnreliableCommands->sentinel).next == &sentUnreliableCommands->sentinel)))) {
    enet_peer_disconnect(peer,peer->eventData);
  }
  return iVar35;
LAB_00107a24:
  local_70 = p_Var27;
  bVar26 = false;
  goto LAB_0010779d;
}

Assistant:

static int enet_protocol_check_outgoing_commands(ENetHost *host, ENetPeer *peer, ENetList *sentUnreliableCommands) {
        ENetProtocol *command = &host->commands[host->commandCount];
        ENetBuffer *buffer    = &host->buffers[host->bufferCount];
        ENetOutgoingCommand *outgoingCommand = NULL;
        ENetListIterator currentCommand, currentSendReliableCommand;
        ENetChannel *channel = NULL;
        enet_uint16 reliableWindow = 0;
        size_t commandSize=0;
        int windowWrap = 0, canPing = 1;

        currentCommand = enet_list_begin(&peer->outgoingCommands);
        currentSendReliableCommand = enet_list_begin (&peer->outgoingSendReliableCommands);

        for (;;) {
            if (currentCommand != enet_list_end (& peer->outgoingCommands))
            {
                outgoingCommand = (ENetOutgoingCommand *) currentCommand;
                if (currentSendReliableCommand != enet_list_end (& peer->outgoingSendReliableCommands) && ENET_TIME_LESS (((ENetOutgoingCommand *) currentSendReliableCommand)->queueTime, outgoingCommand->queueTime)) {
                    goto useSendReliableCommand;
                }
                currentCommand = enet_list_next (currentCommand);
            } else if (currentSendReliableCommand != enet_list_end (& peer->outgoingSendReliableCommands)) {
                useSendReliableCommand:
                outgoingCommand = (ENetOutgoingCommand *) currentSendReliableCommand;
                currentSendReliableCommand = enet_list_next (currentSendReliableCommand);
            } else {
                break;
            }


            if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
                channel = outgoingCommand->command.header.channelID < peer->channelCount ? & peer->channels [outgoingCommand->command.header.channelID] : NULL;
                reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
                if (channel != NULL) {
                    if (windowWrap) {
                        continue;
                    } else if (outgoingCommand->sendAttempts < 1 && 
                            !(outgoingCommand->reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) &&
                            (channel->reliableWindows [(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE ||
                            channel->usedReliableWindows & ((((1u << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) << reliableWindow) | 
                            (((1u << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow))))) 
                    {
                        windowWrap = 1;
                        currentSendReliableCommand = enet_list_end (& peer->outgoingSendReliableCommands);
                        continue;
                    }
                }

                if (outgoingCommand->packet != NULL) {
                    enet_uint32 windowSize = (peer->packetThrottle * peer->windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;

                    if (peer->reliableDataInTransit + outgoingCommand->fragmentLength > ENET_MAX (windowSize, peer->mtu))
                    {
                        currentSendReliableCommand = enet_list_end (& peer->outgoingSendReliableCommands);
                        continue;
                    }
                }

                canPing = 0;
            }

            commandSize = commandSizes[outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK];
            if (command >= &host->commands[sizeof(host->commands) / sizeof(ENetProtocol)] ||
                buffer + 1 >= &host->buffers[sizeof(host->buffers) / sizeof(ENetBuffer)] ||
                peer->mtu - host->packetSize < commandSize ||
                (outgoingCommand->packet != NULL &&
                (enet_uint16) (peer->mtu - host->packetSize) < (enet_uint16) (commandSize + outgoingCommand->fragmentLength))
            ) {
                peer->flags |= ENET_PEER_FLAG_CONTINUE_SENDING;
                break;
            }

            if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
                channel = outgoingCommand->command.header.channelID < peer->channelCount ? & peer->channels [outgoingCommand->command.header.channelID] : NULL;
                reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
                if (channel != NULL && outgoingCommand->sendAttempts < 1) {
                    channel->usedReliableWindows |= 1u << reliableWindow;
                    ++channel->reliableWindows[reliableWindow];
                }

                ++outgoingCommand->sendAttempts;

                if (outgoingCommand->roundTripTimeout == 0) {
                    outgoingCommand->roundTripTimeout = peer->roundTripTime + 4 * peer->roundTripTimeVariance;
                }

                if (enet_list_empty(&peer->sentReliableCommands)) {
                    peer->nextTimeout = host->serviceTime + outgoingCommand->roundTripTimeout;
                }

                enet_list_insert(enet_list_end(&peer->sentReliableCommands), enet_list_remove(&outgoingCommand->outgoingCommandList));

                outgoingCommand->sentTime = host->serviceTime;

                host->headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;
                peer->reliableDataInTransit += outgoingCommand->fragmentLength;
            } else {
                if (outgoingCommand->packet != NULL && outgoingCommand->fragmentOffset == 0) {
                    peer->packetThrottleCounter += ENET_PEER_PACKET_THROTTLE_COUNTER;
                    peer->packetThrottleCounter %= ENET_PEER_PACKET_THROTTLE_SCALE;

                    if (peer->packetThrottleCounter > peer->packetThrottle) {
                        enet_uint16 reliableSequenceNumber = outgoingCommand->reliableSequenceNumber,
                                    unreliableSequenceNumber = outgoingCommand->unreliableSequenceNumber;
                        for (;;)
                        {
                            --outgoingCommand->packet->referenceCount;

                            if (outgoingCommand->packet->referenceCount == 0) {
                                enet_packet_destroy(outgoingCommand->packet);
                            }

                            enet_list_remove(& outgoingCommand->outgoingCommandList);
                            enet_free(outgoingCommand);

                            if (currentCommand == enet_list_end (& peer->outgoingCommands)) {
                                break;
                            }

                            outgoingCommand = (ENetOutgoingCommand *) currentCommand;
                            if (outgoingCommand->reliableSequenceNumber != reliableSequenceNumber ||
                                outgoingCommand->unreliableSequenceNumber != unreliableSequenceNumber) {
                                break;
                            }

                            currentCommand = enet_list_next(currentCommand);
                        }

                        continue;
                    }
                }

                enet_list_remove(&outgoingCommand->outgoingCommandList);

                if (outgoingCommand->packet != NULL) {
                    enet_list_insert(enet_list_end (sentUnreliableCommands), outgoingCommand);
                }
            }


            buffer->data       = command;
            buffer->dataLength = commandSize;

            host->packetSize  += buffer->dataLength;

            *command = outgoingCommand->command;

            if (outgoingCommand->packet != NULL) {
                ++buffer;
                buffer->data       = outgoingCommand->packet->data + outgoingCommand->fragmentOffset;
                buffer->dataLength = outgoingCommand->fragmentLength;
                host->packetSize += outgoingCommand->fragmentLength;
            } else if(! (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)) {
                enet_free(outgoingCommand);
            }

            ++peer->packetsSent;
            ++peer->totalPacketsSent;

            ++command;
            ++buffer;
        }

        host->commandCount = command - host->commands;
        host->bufferCount  = buffer - host->buffers;

        if (peer->state == ENET_PEER_STATE_DISCONNECT_LATER &&
            !enet_peer_has_outgoing_commands (peer) &&
            enet_list_empty (sentUnreliableCommands)) {
                enet_peer_disconnect (peer, peer->eventData);
            }

        return canPing;
    }